

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_3x3_winograd.h
# Opt level: O1

void ncnn::conv3x3s1_winograd23(Mat *bottom_blob,Mat *top_blob,Mat *AT,Mat *bias,int nT,Option *opt)

{
  float fVar1;
  undefined4 uVar2;
  undefined4 uVar6;
  ulong uVar3;
  ulong uVar4;
  undefined8 uVar5;
  undefined1 auVar7 [32];
  undefined4 uVar8;
  size_t sVar9;
  size_t sVar10;
  int iVar11;
  uint uVar12;
  int *piVar13;
  void *pvVar14;
  int iVar15;
  int iVar16;
  void *pvVar17;
  long lVar18;
  long lVar19;
  int iVar20;
  int iVar21;
  undefined1 (*pauVar22) [32];
  undefined1 (*pauVar23) [16];
  undefined8 *puVar24;
  undefined8 *puVar25;
  float *pfVar26;
  float *pfVar27;
  long lVar28;
  ulong uVar29;
  float *pfVar30;
  long lVar31;
  int iVar32;
  int m_4;
  uint uVar33;
  uint uVar34;
  int iVar35;
  int m_2;
  uint uVar36;
  float fVar37;
  float fVar39;
  float fVar40;
  undefined1 auVar38 [16];
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 in_ZMM1 [64];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [32];
  undefined1 auVar61 [16];
  int TILE_K;
  int TILE_N;
  int TILE_M;
  Mat m;
  Mat m_1;
  float tmp [2] [4] [8];
  Allocator *_allocator;
  int local_3b0;
  uint local_3ac;
  void *local_3a8;
  void *local_3a0;
  void *local_398;
  Mat *local_390;
  ulong local_388;
  ulong local_380;
  void *local_378;
  int local_36c;
  ulong local_368;
  int local_35c;
  int local_358;
  uint local_354;
  Mat local_350;
  long local_300;
  void *local_2f8;
  ulong local_2f0;
  long local_2e8;
  Mat *local_2e0;
  int local_2d4;
  ulong local_2d0;
  ulong local_2c8;
  ulong local_2c0;
  ulong local_2b8;
  Mat local_2b0;
  Mat local_260;
  ulong local_210;
  long local_208;
  long local_200;
  void *local_1f8;
  Mat local_1f0;
  ulong local_1a0;
  Mat *local_198;
  void *local_190;
  long local_188;
  long local_180;
  long local_178;
  ulong local_170;
  Mat *local_168;
  undefined1 local_160 [8];
  float afStack_158 [2];
  undefined8 uStack_150;
  float afStack_148 [2];
  Allocator *local_140;
  int iStack_138;
  int iStack_134;
  float fStack_130;
  int iStack_12c;
  int iStack_128;
  size_t local_120 [4];
  float local_100 [8];
  undefined1 auStack_e0 [128];
  undefined1 auStack_60 [48];
  undefined1 auVar57 [32];
  
  local_3a8 = (void *)CONCAT44(local_3a8._4_4_,nT);
  uVar2 = top_blob->w;
  uVar6 = top_blob->h;
  auVar46._4_4_ = uVar6;
  auVar46._0_4_ = uVar2;
  auVar38 = vpcmpeqd_avx(in_ZMM1._0_16_,in_ZMM1._0_16_);
  auVar46._8_8_ = 0;
  auVar38 = vpsubd_avx(auVar46,auVar38);
  auVar46 = vpsrld_avx(auVar38,0x1f);
  auVar38 = vpaddd_avx(auVar38,auVar46);
  auVar38 = vpsrad_avx(auVar38,1);
  uVar36 = top_blob->elempack * top_blob->c;
  uVar34 = auVar38._4_4_ * auVar38._0_4_;
  uVar33 = bottom_blob->elempack * bottom_blob->c;
  local_390 = bottom_blob;
  local_2e0 = top_blob;
  local_198 = bias;
  local_168 = AT;
  get_optimal_tile_mnk(uVar36,uVar34,uVar33,(int *)&local_354,(int *)&local_3ac,&local_3b0,nT);
  local_2d4 = (int)(uVar36 + local_354 + -1) / (int)local_354;
  iVar32 = (int)(uVar34 + local_3ac + -1) / (int)local_3ac;
  iVar35 = (int)(local_3b0 + uVar33 + -1) / local_3b0;
  iVar20 = local_3b0 * local_3ac;
  _allocator = opt->workspace_allocator;
  local_260.cstep = 0;
  local_260.data = (void *)0x0;
  local_260.refcount._0_4_ = 0;
  local_260.refcount._4_4_ = 0;
  local_260.elemsize = 0;
  local_260.elempack = 0;
  local_260.allocator = (Allocator *)0x0;
  local_260.dims = 0;
  local_260.w = 0;
  local_260.h = 0;
  local_260.d = 0;
  local_260.c = 0;
  local_2d0 = (ulong)uVar34;
  local_2c8 = (ulong)uVar33;
  local_1a0 = (ulong)uVar36;
  Mat::create(&local_260,iVar20,0x10,iVar35,iVar32,4,_allocator);
  uVar33 = iVar35 * iVar32;
  iVar20 = iVar20 * 0x10;
  if (((int)local_3a8 < 2) || ((int)local_3a8 <= (int)uVar33)) {
    local_120[0] = 0;
    local_160 = (undefined1  [8])0x0;
    afStack_158[0] = 0.0;
    afStack_158[1] = 0.0;
    uStack_150 = 0;
    afStack_148[0] = 0.0;
    local_140 = (Allocator *)0x0;
    iStack_138 = 0;
    iStack_134 = 0;
    fStack_130 = 0.0;
    iStack_12c = 0;
    iStack_128 = 0;
    Mat::create((Mat *)local_160,iVar20,1,(int)local_3a8,4,opt->workspace_allocator);
    if (0 < (int)uVar33) {
      pvVar17 = (void *)0x0;
      do {
        iVar20 = (int)pvVar17 / iVar35;
        uVar36 = (int)pvVar17 % iVar35;
        local_398 = (void *)CONCAT44(local_398._4_4_,iVar20);
        iVar20 = local_3ac * iVar20;
        iVar32 = local_3b0 * uVar36;
        uVar34 = (int)local_2d0 - iVar20;
        if ((int)local_3ac < (int)uVar34) {
          uVar34 = local_3ac;
        }
        iVar21 = (int)local_2c8 - iVar32;
        if (local_3b0 < iVar21) {
          iVar21 = local_3b0;
        }
        local_3a0 = pvVar17;
        iVar15 = get_omp_thread_num();
        local_350.data = (void *)((long)iVar15 * local_120[0] * uStack_150 + (long)local_160);
        local_350.refcount._0_4_ = 0;
        local_350.refcount._4_4_ = 0;
        local_350.elemsize = uStack_150;
        local_350.elempack = (int)afStack_148[0];
        local_350.allocator = local_140;
        local_350.w = iStack_134;
        local_350.h = (int)fStack_130;
        local_350.d = 1;
        local_350.c = iStack_12c;
        local_350.dims = iStack_138 + -1;
        local_350.cstep =
             (uStack_150 * (long)(int)fStack_130 * (long)iStack_134 + 0xf & 0xfffffffffffffff0) /
             uStack_150;
        if (iStack_138 == 4) {
          local_350.cstep = (long)(int)fStack_130 * (long)iStack_134;
        }
        conv3x3s1_winograd23_transform_input_tile
                  (local_390,&local_350,iVar20,uVar34,iVar32,iVar21,(int)_allocator);
        local_2b0.cstep = (long)local_260.h * (long)local_260.w;
        local_2b0.data =
             (void *)((long)local_260.data +
                     uVar36 * local_260.elemsize * local_2b0.cstep +
                     (long)(int)local_398 * local_260.cstep * local_260.elemsize);
        local_2b0.refcount._0_4_ = 0;
        local_2b0.refcount._4_4_ = 0;
        local_2b0.elemsize = local_260.elemsize;
        local_2b0.elempack = local_260.elempack;
        local_2b0.allocator = local_260.allocator;
        local_2b0.dims = 2;
        local_2b0.w = local_260.w;
        local_2b0.h = local_260.h;
        local_2b0.d = 1;
        local_2b0.c = 1;
        transpose_pack_B_tile(&local_350,&local_2b0,0x10,uVar34,iVar21,(int)local_2b0.cstep);
        piVar13 = (int *)CONCAT44(local_2b0.refcount._4_4_,local_2b0.refcount._0_4_);
        if (piVar13 != (int *)0x0) {
          LOCK();
          *piVar13 = *piVar13 + -1;
          UNLOCK();
          if (*piVar13 == 0) {
            if (local_2b0.allocator == (Allocator *)0x0) {
              if (local_2b0.data != (void *)0x0) {
                free(local_2b0.data);
              }
            }
            else {
              (*(local_2b0.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        local_2b0.cstep = 0;
        local_2b0.data = (void *)0x0;
        local_2b0.refcount._0_4_ = 0;
        local_2b0.refcount._4_4_ = 0;
        local_2b0.elemsize = 0;
        local_2b0.elempack = 0;
        local_2b0.dims = 0;
        local_2b0.w = 0;
        local_2b0.h = 0;
        local_2b0.d = 0;
        local_2b0.c = 0;
        piVar13 = (int *)CONCAT44(local_350.refcount._4_4_,local_350.refcount._0_4_);
        if (piVar13 != (int *)0x0) {
          LOCK();
          *piVar13 = *piVar13 + -1;
          UNLOCK();
          if (*piVar13 == 0) {
            if (local_350.allocator == (Allocator *)0x0) {
              if (local_350.data != (void *)0x0) {
                free(local_350.data);
              }
            }
            else {
              (*(local_350.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        local_350.cstep = 0;
        local_350.data = (void *)0x0;
        local_350.refcount._0_4_ = 0;
        local_350.refcount._4_4_ = 0;
        local_350.elemsize = 0;
        local_350.elempack = 0;
        local_350.dims = 0;
        local_350.w = 0;
        local_350.h = 0;
        local_350.d = 0;
        local_350.c = 0;
        uVar34 = (int)local_3a0 + 1;
        pvVar17 = (void *)(ulong)uVar34;
      } while (uVar33 != uVar34);
    }
    piVar13 = (int *)CONCAT44(afStack_158[1],afStack_158[0]);
    if (piVar13 != (int *)0x0) {
      LOCK();
      *piVar13 = *piVar13 + -1;
      UNLOCK();
      if (*piVar13 == 0) {
        if (local_140 == (Allocator *)0x0) {
          if (local_160 != (undefined1  [8])0x0) {
            free((void *)local_160);
          }
        }
        else {
          (*local_140->_vptr_Allocator[3])();
        }
      }
    }
  }
  else {
    local_120[0] = 0;
    local_160 = (undefined1  [8])0x0;
    afStack_158[0] = 0.0;
    afStack_158[1] = 0.0;
    uStack_150 = 0;
    afStack_148[0] = 0.0;
    local_140 = (Allocator *)0x0;
    iStack_138 = 0;
    iStack_134 = 0;
    fStack_130 = 0.0;
    iStack_12c = 0;
    iStack_128 = 0;
    Mat::create((Mat *)local_160,iVar20,4,opt->workspace_allocator);
    if (0 < (int)uVar33) {
      uVar34 = 0;
      do {
        iVar20 = local_3ac * ((int)uVar34 / iVar35);
        iVar32 = local_3b0 * ((int)uVar34 % iVar35);
        uVar36 = (int)local_2d0 - iVar20;
        if ((int)local_3ac < (int)uVar36) {
          uVar36 = local_3ac;
        }
        iVar21 = (int)local_2c8 - iVar32;
        if (local_3b0 < iVar21) {
          iVar21 = local_3b0;
        }
        conv3x3s1_winograd23_transform_input_tile
                  (local_390,(Mat *)local_160,iVar20,uVar36,iVar32,iVar21,(int)_allocator);
        local_350.cstep = (long)local_260.h * (long)local_260.w;
        local_350.data =
             (void *)((long)local_260.data +
                     (uint)((int)uVar34 % iVar35) * local_260.elemsize * local_350.cstep +
                     (long)((int)uVar34 / iVar35) * local_260.cstep * local_260.elemsize);
        local_350.refcount._0_4_ = 0;
        local_350.refcount._4_4_ = 0;
        local_350.elemsize = local_260.elemsize;
        local_350.elempack = local_260.elempack;
        local_350.allocator = local_260.allocator;
        local_350.dims = 2;
        local_350.w = local_260.w;
        local_350.h = local_260.h;
        local_350.d = 1;
        local_350.c = 1;
        transpose_pack_B_tile((Mat *)local_160,&local_350,0x10,uVar36,iVar21,(int)local_350.cstep);
        piVar13 = (int *)CONCAT44(local_350.refcount._4_4_,local_350.refcount._0_4_);
        if (piVar13 != (int *)0x0) {
          LOCK();
          *piVar13 = *piVar13 + -1;
          UNLOCK();
          if (*piVar13 == 0) {
            if (local_350.allocator == (Allocator *)0x0) {
              if (local_350.data != (void *)0x0) {
                free(local_350.data);
              }
            }
            else {
              (*(local_350.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        local_350.cstep = 0;
        local_350.data = (void *)0x0;
        local_350.refcount._0_4_ = 0;
        local_350.refcount._4_4_ = 0;
        local_350.elemsize = 0;
        local_350.elempack = 0;
        local_350.dims = 0;
        local_350.w = 0;
        local_350.h = 0;
        local_350.d = 0;
        local_350.c = 0;
        uVar34 = uVar34 + 1;
      } while (uVar33 != uVar34);
    }
    piVar13 = (int *)CONCAT44(afStack_158[1],afStack_158[0]);
    if (piVar13 != (int *)0x0) {
      LOCK();
      *piVar13 = *piVar13 + -1;
      UNLOCK();
      if (*piVar13 == 0) {
        if (local_140 == (Allocator *)0x0) {
          if (local_160 != (undefined1  [8])0x0) {
            free((void *)local_160);
          }
        }
        else {
          (*local_140->_vptr_Allocator[3])();
        }
      }
    }
  }
  local_120[0] = 0;
  afStack_148[0] = 0.0;
  uStack_150 = 0;
  afStack_158[1] = 0.0;
  afStack_158[0] = 0.0;
  local_160 = (undefined1  [8])0x0;
  iStack_138 = 0;
  iStack_134 = 0;
  fStack_130 = 0.0;
  iStack_12c = 0;
  iStack_128 = 0;
  local_350.cstep = 0;
  local_350.data = (void *)0x0;
  local_350.refcount._0_4_ = 0;
  local_350.refcount._4_4_ = 0;
  local_350.elemsize = 0;
  local_350.elempack = 0;
  local_350.allocator = (Allocator *)0x0;
  local_350.dims = 0;
  local_350.w = 0;
  local_350.h = 0;
  local_350.d = 0;
  local_350.c = 0;
  Mat::create(&local_350,local_3ac * local_354 * 0x10,1,(int)local_3a8,4,opt->workspace_allocator);
  if (0 < local_2d4) {
    local_35c = 0;
    do {
      uVar33 = local_354;
      iVar20 = get_omp_thread_num();
      local_2b0.data =
           (void *)((long)iVar20 * local_350.cstep * local_350.elemsize + (long)local_350.data);
      local_2b0.refcount._0_4_ = 0;
      local_2b0.refcount._4_4_ = 0;
      local_2b0.elemsize = local_350.elemsize;
      local_2b0.elempack = local_350.elempack;
      local_2b0.allocator = local_350.allocator;
      local_2b0.w = local_350.w;
      local_2b0.h = local_350.h;
      local_2b0.d = 1;
      local_2b0.c = local_350.d;
      local_2b0.dims = local_350.dims + -1;
      local_2b0.cstep =
           (local_350.elemsize * (long)local_350.h * (long)local_350.w + 0xf & 0xfffffffffffffff0) /
           local_350.elemsize;
      if (local_350.dims == 4) {
        local_2b0.cstep = (long)local_350.h * (long)local_350.w;
      }
      uVar36 = uVar33 * local_35c;
      local_2c0 = (ulong)uVar36;
      uVar34 = (int)local_1a0 - uVar36;
      if ((int)uVar33 < (int)uVar34) {
        uVar34 = uVar33;
      }
      if (0 < (int)local_2d0) {
        local_300 = (long)(int)uVar36;
        local_170 = (ulong)uVar34;
        local_200 = (long)(int)uVar34;
        uVar29 = 0;
        do {
          uVar33 = (int)local_2d0 - (int)uVar29;
          if ((int)local_3ac < (int)uVar33) {
            uVar33 = local_3ac;
          }
          local_388 = (ulong)uVar33;
          local_368 = uVar29;
          if (0 < (int)local_2c8) {
            iVar20 = 0;
            do {
              iVar32 = (int)local_2c8 - iVar20;
              if (local_3b0 < iVar32) {
                iVar32 = local_3b0;
              }
              iStack_134 = local_168->w;
              fStack_130 = (float)local_168->h;
              uStack_150 = local_168->elemsize;
              afStack_148[0] = (float)local_168->elempack;
              local_140 = local_168->allocator;
              local_120[0] = (long)(int)fStack_130 * (long)iStack_134;
              local_160 = (undefined1  [8])
                          ((long)local_168->data +
                          uStack_150 * local_120[0] * (long)(iVar20 / local_3b0) +
                          (long)(int)((long)((ulong)(uint)((int)local_2c0 >> 0x1f) << 0x20 |
                                            local_2c0 & 0xffffffff) / (long)(int)local_354) *
                          local_168->cstep * uStack_150);
              afStack_158[0] = 0.0;
              afStack_158[1] = 0.0;
              iStack_138 = 2;
              iStack_12c = 1;
              iStack_128 = 1;
              local_1f0.cstep = (long)local_260.h * (long)local_260.w;
              local_1f0.data =
                   (void *)((long)local_260.data +
                           local_260.elemsize * local_1f0.cstep * (long)(iVar20 / local_3b0) +
                           (long)(int)((long)((ulong)(uint)((int)local_368 >> 0x1f) << 0x20 |
                                             local_368 & 0xffffffff) / (long)(int)local_3ac) *
                           local_260.cstep * local_260.elemsize);
              local_1f0.refcount._0_4_ = 0;
              local_1f0.refcount._4_4_ = 0;
              local_1f0.elemsize = local_260.elemsize;
              local_1f0.elempack = local_260.elempack;
              local_1f0.allocator = local_260.allocator;
              local_1f0.dims = 2;
              local_1f0.w = local_260.w;
              local_1f0.h = local_260.h;
              local_1f0.d = 1;
              local_1f0.c = 1;
              gemm_transB_packed_tile
                        ((Mat *)local_160,&local_1f0,&local_2b0,0x10,uVar34,(int)local_388,iVar20,
                         iVar32);
              piVar13 = (int *)CONCAT44(local_1f0.refcount._4_4_,local_1f0.refcount._0_4_);
              if (piVar13 != (int *)0x0) {
                LOCK();
                *piVar13 = *piVar13 + -1;
                UNLOCK();
                if (*piVar13 == 0) {
                  if (local_1f0.allocator == (Allocator *)0x0) {
                    if (local_1f0.data != (void *)0x0) {
                      free(local_1f0.data);
                    }
                  }
                  else {
                    (*(local_1f0.allocator)->_vptr_Allocator[3])();
                  }
                }
              }
              local_1f0.cstep = 0;
              local_1f0.data = (void *)0x0;
              local_1f0.refcount._0_4_ = 0;
              local_1f0.refcount._4_4_ = 0;
              local_1f0.elemsize = 0;
              local_1f0.elempack = 0;
              local_1f0.dims = 0;
              local_1f0.w = 0;
              local_1f0.h = 0;
              local_1f0.d = 0;
              local_1f0.c = 0;
              piVar13 = (int *)CONCAT44(afStack_158[1],afStack_158[0]);
              if (piVar13 != (int *)0x0) {
                LOCK();
                *piVar13 = *piVar13 + -1;
                UNLOCK();
                if (*piVar13 == 0) {
                  if (local_140 == (Allocator *)0x0) {
                    if (local_160 != (undefined1  [8])0x0) {
                      free((void *)local_160);
                    }
                  }
                  else {
                    (*local_140->_vptr_Allocator[3])();
                  }
                }
              }
              local_120[0] = 0;
              local_160 = (undefined1  [8])0x0;
              afStack_158[0] = 0.0;
              afStack_158[1] = 0.0;
              uStack_150 = 0;
              afStack_148[0] = 0.0;
              iStack_138 = 0;
              iStack_134 = 0;
              fStack_130 = 0.0;
              iStack_12c = 0;
              iStack_128 = 0;
              iVar20 = iVar20 + local_3b0;
            } while (iVar20 < (int)local_2c8);
          }
          iVar20 = local_2e0->w;
          iVar32 = local_2e0->elempack;
          iVar35 = local_2e0->h;
          uVar33 = (int)local_2e0->cstep * iVar32;
          local_210 = (ulong)uVar33;
          local_36c = (iVar20 - (iVar20 + 1 >> 0x1f)) + 1 >> 1;
          iVar21 = (int)local_388;
          local_358 = iVar21 * 0x10;
          uVar29 = 0;
          local_378 = local_198->data;
          iVar15 = (int)local_368;
          if (7 < (int)uVar34) {
            lVar31 = (long)(int)uVar33;
            local_398 = (void *)(long)(int)(uVar33 * 4);
            local_3a0 = (void *)(long)(int)(uVar33 * 5);
            local_3a8 = (void *)(long)(int)(uVar33 * 7);
            local_390 = (Mat *)(long)(iVar32 * iVar20);
            local_208 = CONCAT44(local_208._4_4_,iVar21 * 0x80);
            local_178 = (long)(iVar21 * 8) * 4;
            local_180 = (long)local_358 * 4;
            local_188 = (long)(iVar21 * 0x18) * 4;
            local_190 = (void *)((long)local_378 + local_300 * 4);
            local_1f8 = (void *)(local_388 & 0xffffffff);
            local_2f0 = 0;
            uVar29 = 0;
            do {
              local_2b8 = uVar29;
              if (local_378 == (void *)0x0) {
                fVar37 = 0.0;
                fVar39 = 0.0;
                fVar40 = 0.0;
                fVar41 = 0.0;
                fVar42 = 0.0;
                fVar43 = 0.0;
                fVar44 = 0.0;
                fVar45 = 0.0;
              }
              else {
                pfVar26 = (float *)((long)local_190 + local_2b8 * 4);
                fVar37 = *pfVar26;
                fVar39 = pfVar26[1];
                fVar40 = pfVar26[2];
                fVar41 = pfVar26[3];
                fVar42 = pfVar26[4];
                fVar43 = pfVar26[5];
                fVar44 = pfVar26[6];
                fVar45 = pfVar26[7];
              }
              if (0 < iVar21) {
                lVar18 = (long)(int)local_2f0;
                local_2e8 = (long)(((int)local_2c0 + (int)local_2b8) / iVar32);
                pvVar17 = (void *)0x0;
                uVar29 = 0;
                do {
                  local_380 = uVar29;
                  local_2f8 = pvVar17;
                  iVar16 = iVar15 + (int)local_2f8;
                  lVar19 = (long)local_2b0.data + local_380;
                  lVar28 = -0x80;
                  do {
                    auVar7 = *(undefined1 (*) [32])(lVar19 + local_178 + lVar18 * 4);
                    auVar50 = *(undefined1 (*) [32])(lVar19 + local_180 + lVar18 * 4);
                    pfVar26 = (float *)(lVar19 + lVar18 * 4);
                    auVar60._0_4_ = auVar7._0_4_ + *pfVar26 + auVar50._0_4_;
                    auVar60._4_4_ = auVar7._4_4_ + pfVar26[1] + auVar50._4_4_;
                    auVar60._8_4_ = auVar7._8_4_ + pfVar26[2] + auVar50._8_4_;
                    auVar60._12_4_ = auVar7._12_4_ + pfVar26[3] + auVar50._12_4_;
                    auVar60._16_4_ = auVar7._16_4_ + pfVar26[4] + auVar50._16_4_;
                    auVar60._20_4_ = auVar7._20_4_ + pfVar26[5] + auVar50._20_4_;
                    auVar60._24_4_ = auVar7._24_4_ + pfVar26[6] + auVar50._24_4_;
                    auVar60._28_4_ = auVar7._28_4_ + pfVar26[7] + auVar50._28_4_;
                    auVar7 = vsubps_avx(auVar7,auVar50);
                    pfVar26 = (float *)(lVar19 + local_188 + lVar18 * 4);
                    auVar50._0_4_ = auVar7._0_4_ + *pfVar26;
                    auVar50._4_4_ = auVar7._4_4_ + pfVar26[1];
                    auVar50._8_4_ = auVar7._8_4_ + pfVar26[2];
                    auVar50._12_4_ = auVar7._12_4_ + pfVar26[3];
                    auVar50._16_4_ = auVar7._16_4_ + pfVar26[4];
                    auVar50._20_4_ = auVar7._20_4_ + pfVar26[5];
                    auVar50._24_4_ = auVar7._24_4_ + pfVar26[6];
                    auVar50._28_4_ = auVar7._28_4_ + pfVar26[7];
                    *(undefined1 (*) [32])(auStack_e0 + lVar28) = auVar60;
                    *(undefined1 (*) [32])(auStack_60 + lVar28) = auVar50;
                    lVar19 = lVar19 + (long)(iVar21 << 5) * 4;
                    lVar28 = lVar28 + 0x20;
                  } while (lVar28 != 0);
                  iVar11 = iVar16 % local_36c;
                  uVar36 = (iVar16 / local_36c) * 2;
                  pauVar22 = (undefined1 (*) [32])
                             ((long)local_2e0->data +
                             (long)(iVar11 * 2 * iVar32) * 4 +
                             (long)local_2e0->w * local_2e0->elemsize * (long)(int)uVar36 +
                             local_2e0->cstep * local_2e8 * local_2e0->elemsize);
                  iVar16 = iVar11 * 2 + 1;
                  pfVar26 = local_100;
                  lVar19 = 0;
                  do {
                    if ((int)(uVar36 | (uint)lVar19) < iVar35) {
                      auVar51._0_4_ = fVar37 + pfVar26[-0x10];
                      auVar51._4_4_ = fVar39 + pfVar26[-0xf];
                      auVar51._8_4_ = fVar40 + pfVar26[-0xe];
                      auVar51._12_4_ = fVar41 + pfVar26[-0xd];
                      auVar51._16_4_ = fVar42 + pfVar26[-0xc];
                      auVar51._20_4_ = fVar43 + pfVar26[-0xb];
                      auVar51._24_4_ = fVar44 + pfVar26[-10];
                      auVar51._28_4_ = fVar45 + pfVar26[-9];
                      auVar7 = *(undefined1 (*) [32])(pfVar26 + -8);
                      auVar53._0_4_ = auVar51._0_4_ + pfVar26[-0x18] + auVar7._0_4_;
                      auVar53._4_4_ = auVar51._4_4_ + pfVar26[-0x17] + auVar7._4_4_;
                      auVar53._8_4_ = auVar51._8_4_ + pfVar26[-0x16] + auVar7._8_4_;
                      auVar53._12_4_ = auVar51._12_4_ + pfVar26[-0x15] + auVar7._12_4_;
                      auVar57._16_4_ = auVar51._16_4_ + pfVar26[-0x14] + auVar7._16_4_;
                      auVar57._0_16_ = auVar53;
                      auVar57._20_4_ = auVar51._20_4_ + pfVar26[-0x13] + auVar7._20_4_;
                      auVar57._24_4_ = auVar51._24_4_ + pfVar26[-0x12] + auVar7._24_4_;
                      auVar57._28_4_ = auVar51._28_4_ + pfVar26[-0x11] + auVar7._28_4_;
                      auVar7 = vsubps_avx(auVar51,auVar7);
                      auVar38._0_4_ = auVar7._0_4_ + *pfVar26;
                      auVar38._4_4_ = auVar7._4_4_ + pfVar26[1];
                      auVar38._8_4_ = auVar7._8_4_ + pfVar26[2];
                      auVar38._12_4_ = auVar7._12_4_ + pfVar26[3];
                      auVar52._16_4_ = auVar7._16_4_ + pfVar26[4];
                      auVar52._0_16_ = auVar38;
                      auVar52._20_4_ = auVar7._20_4_ + pfVar26[5];
                      auVar52._24_4_ = auVar7._24_4_ + pfVar26[6];
                      auVar52._28_4_ = auVar7._28_4_ + pfVar26[7];
                      auVar47 = auVar57._16_16_;
                      auVar46 = auVar52._16_16_;
                      if (iVar32 == 1) {
                        *(float *)*pauVar22 = auVar53._0_4_;
                        uVar8 = vextractps_avx(auVar53,1);
                        *(undefined4 *)(*pauVar22 + lVar31 * 4) = uVar8;
                        uVar8 = vextractps_avx(auVar53,2);
                        *(undefined4 *)(*pauVar22 + (long)(int)(uVar33 * 2) * 4) = uVar8;
                        uVar8 = vextractps_avx(auVar53,3);
                        *(undefined4 *)(*pauVar22 + (long)(int)(uVar33 * 3) * 4) = uVar8;
                        *(float *)(*pauVar22 + (long)local_398 * 4) = auVar57._16_4_;
                        uVar8 = vextractps_avx(auVar47,1);
                        *(undefined4 *)(*pauVar22 + (long)local_3a0 * 4) = uVar8;
                        uVar8 = vextractps_avx(auVar47,2);
                        *(undefined4 *)(*pauVar22 + (long)(int)(uVar33 * 6) * 4) = uVar8;
                        uVar8 = vextractps_avx(auVar47,3);
                        *(undefined4 *)(*pauVar22 + (long)local_3a8 * 4) = uVar8;
                        if (iVar16 < iVar20) {
                          *(float *)(*pauVar22 + 4) = auVar38._0_4_;
                          uVar8 = vextractps_avx(auVar38,1);
                          *(undefined4 *)(*pauVar22 + lVar31 * 4 + 4) = uVar8;
                          uVar8 = vextractps_avx(auVar38,2);
                          *(undefined4 *)(*pauVar22 + (long)(int)(uVar33 * 2) * 4 + 4) = uVar8;
                          uVar8 = vextractps_avx(auVar38,3);
                          *(undefined4 *)(*pauVar22 + (long)(int)(uVar33 * 3) * 4 + 4) = uVar8;
                          *(float *)(*pauVar22 + (long)local_398 * 4 + 4) = auVar52._16_4_;
                          uVar8 = vextractps_avx(auVar46,1);
                          *(undefined4 *)(*pauVar22 + (long)local_3a0 * 4 + 4) = uVar8;
                          uVar8 = vextractps_avx(auVar46,2);
                          *(undefined4 *)(*pauVar22 + (long)(int)(uVar33 * 6) * 4 + 4) = uVar8;
                          uVar8 = vextractps_avx(auVar46,3);
                          *(undefined4 *)(*pauVar22 + (long)local_3a8 * 4 + 4) = uVar8;
                        }
                      }
                      else if (iVar32 == 4) {
                        *(undefined1 (*) [16])*pauVar22 = auVar53;
                        *(undefined1 (*) [16])(*pauVar22 + lVar31 * 4) = auVar47;
                        if (iVar16 < iVar20) {
                          *(undefined1 (*) [16])(*pauVar22 + 0x10) = auVar38;
                          *(undefined1 (*) [16])(*pauVar22 + lVar31 * 4 + 0x10) = auVar46;
                        }
                      }
                      else if ((iVar32 == 8) && (*pauVar22 = auVar57, iVar16 < iVar20)) {
                        pauVar22[1] = auVar52;
                      }
                      pauVar22 = (undefined1 (*) [32])(*pauVar22 + (long)local_390 * 4);
                    }
                    lVar19 = lVar19 + 1;
                    pfVar26 = pfVar26 + 0x20;
                  } while (lVar19 == 1);
                  pvVar17 = (void *)((long)local_2f8 + 1U);
                  uVar29 = local_380 + 0x20;
                } while ((void *)((long)local_2f8 + 1U) != local_1f8);
              }
              uVar29 = local_2b8 + 8;
              local_2f0 = (ulong)(uint)((int)local_2f0 + iVar21 * 0x80);
            } while (local_2b8 + 0xf < local_170);
          }
          if ((int)((uint)uVar29 | 3) < (int)uVar34) {
            local_1f8 = (void *)((long)local_378 + local_300 * 4);
            local_390 = (Mat *)(long)(int)uVar33;
            local_3a8 = (void *)(local_388 & 0xffffffff);
            uVar36 = (uint)uVar29 * iVar21 * 0x10;
            local_2e8 = CONCAT44(local_2e8._4_4_,iVar21 * 0x40);
            local_2f0 = (long)(iVar21 * 4) * 4;
            local_2b8 = (long)(iVar21 * 8) * 4;
            local_208 = (long)(iVar21 * 0xc) * 4;
            pvVar17 = (void *)(uVar29 & 0xffffffff);
            do {
              local_2f8 = pvVar17;
              local_380 = (ulong)uVar36;
              if (local_378 == (void *)0x0) {
                fVar37 = 0.0;
                fVar39 = 0.0;
                fVar40 = 0.0;
                fVar41 = 0.0;
              }
              else {
                pfVar26 = (float *)((long)local_1f8 + (long)local_2f8 * 4);
                fVar37 = *pfVar26;
                fVar39 = pfVar26[1];
                fVar40 = pfVar26[2];
                fVar41 = pfVar26[3];
              }
              if (0 < iVar21) {
                lVar31 = (long)(int)uVar36;
                pvVar17 = (void *)0x0;
                pvVar14 = (void *)0x0;
                do {
                  local_398 = pvVar14;
                  local_3a0 = pvVar17;
                  iVar16 = iVar15 + (int)local_3a0;
                  lVar18 = (long)local_2b0.data + (long)local_398;
                  lVar19 = -0x40;
                  do {
                    auVar38 = *(undefined1 (*) [16])(lVar18 + local_2f0 + lVar31 * 4);
                    auVar46 = *(undefined1 (*) [16])(lVar18 + local_2b8 + lVar31 * 4);
                    pfVar26 = (float *)(lVar18 + lVar31 * 4);
                    auVar58._0_4_ = auVar38._0_4_ + *pfVar26 + auVar46._0_4_;
                    auVar58._4_4_ = auVar38._4_4_ + pfVar26[1] + auVar46._4_4_;
                    auVar58._8_4_ = auVar38._8_4_ + pfVar26[2] + auVar46._8_4_;
                    auVar58._12_4_ = auVar38._12_4_ + pfVar26[3] + auVar46._12_4_;
                    auVar38 = vsubps_avx(auVar38,auVar46);
                    pfVar26 = (float *)(lVar18 + local_208 + lVar31 * 4);
                    auVar47._0_4_ = auVar38._0_4_ + *pfVar26;
                    auVar47._4_4_ = auVar38._4_4_ + pfVar26[1];
                    auVar47._8_4_ = auVar38._8_4_ + pfVar26[2];
                    auVar47._12_4_ = auVar38._12_4_ + pfVar26[3];
                    *(undefined1 (*) [16])((long)local_120 + lVar19) = auVar58;
                    *(undefined1 (*) [16])(auStack_e0 + lVar19) = auVar47;
                    lVar18 = lVar18 + (long)local_358 * 4;
                    lVar19 = lVar19 + 0x10;
                  } while (lVar19 != 0);
                  iVar11 = iVar16 % local_36c;
                  uVar12 = (iVar16 / local_36c) * 2;
                  pauVar23 = (undefined1 (*) [16])
                             ((long)local_2e0->data +
                             (long)(iVar11 * 2 * iVar32) * 4 +
                             (long)local_2e0->w * local_2e0->elemsize * (long)(int)uVar12 +
                             local_2e0->cstep * (long)(((int)local_2c0 + (int)local_2f8) / iVar32) *
                             local_2e0->elemsize);
                  iVar16 = iVar11 * 2 + 1;
                  pfVar26 = &fStack_130;
                  lVar18 = 0;
                  do {
                    if ((int)(uVar12 | (uint)lVar18) < iVar35) {
                      auVar48._0_4_ = fVar37 + pfVar26[-8];
                      auVar48._4_4_ = fVar39 + pfVar26[-7];
                      auVar48._8_4_ = fVar40 + pfVar26[-6];
                      auVar48._12_4_ = fVar41 + pfVar26[-5];
                      auVar38 = *(undefined1 (*) [16])(pfVar26 + -4);
                      auVar54._0_4_ = auVar48._0_4_ + pfVar26[-0xc] + auVar38._0_4_;
                      auVar54._4_4_ = auVar48._4_4_ + pfVar26[-0xb] + auVar38._4_4_;
                      auVar54._8_4_ = auVar48._8_4_ + pfVar26[-10] + auVar38._8_4_;
                      auVar54._12_4_ = auVar48._12_4_ + pfVar26[-9] + auVar38._12_4_;
                      auVar38 = vsubps_avx(auVar48,auVar38);
                      auVar49._0_4_ = auVar38._0_4_ + *pfVar26;
                      auVar49._4_4_ = auVar38._4_4_ + pfVar26[1];
                      auVar49._8_4_ = auVar38._8_4_ + pfVar26[2];
                      auVar49._12_4_ = auVar38._12_4_ + pfVar26[3];
                      if (iVar32 == 1) {
                        *(float *)*pauVar23 = auVar54._0_4_;
                        uVar8 = vextractps_avx(auVar54,1);
                        *(undefined4 *)(*pauVar23 + (long)local_390 * 4) = uVar8;
                        uVar8 = vextractps_avx(auVar54,2);
                        *(undefined4 *)(*pauVar23 + (long)(int)(uVar33 * 2) * 4) = uVar8;
                        uVar8 = vextractps_avx(auVar54,3);
                        *(undefined4 *)(*pauVar23 + (long)(int)(uVar33 * 3) * 4) = uVar8;
                        if (iVar16 < iVar20) {
                          *(float *)(*pauVar23 + 4) = auVar49._0_4_;
                          uVar8 = vextractps_avx(auVar49,1);
                          *(undefined4 *)(*pauVar23 + (long)local_390 * 4 + 4) = uVar8;
                          uVar8 = vextractps_avx(auVar49,2);
                          *(undefined4 *)(*pauVar23 + (long)(int)(uVar33 * 2) * 4 + 4) = uVar8;
                          uVar8 = vextractps_avx(auVar49,3);
                          *(undefined4 *)(*pauVar23 + (long)(int)(uVar33 * 3) * 4 + 4) = uVar8;
                        }
                      }
                      else if ((iVar32 == 4) && (*pauVar23 = auVar54, iVar16 < iVar20)) {
                        pauVar23[1] = auVar49;
                      }
                      pauVar23 = (undefined1 (*) [16])(*pauVar23 + (long)(iVar32 * iVar20) * 4);
                    }
                    lVar18 = lVar18 + 1;
                    pfVar26 = pfVar26 + 0x10;
                  } while (lVar18 == 1);
                  pvVar17 = (void *)((long)local_3a0 + 1U);
                  pvVar14 = (void *)((long)local_398 + 0x10);
                } while ((void *)((long)local_3a0 + 1U) != local_3a8);
              }
              uVar36 = uVar36 + iVar21 * 0x40;
              pvVar17 = (void *)((long)local_2f8 + 4U);
            } while ((long)((long)local_2f8 + 7U) < local_200);
            uVar29 = (long)local_2f8 + 4U & 0xffffffff;
          }
          uVar36 = (uint)uVar29;
          if ((int)(uVar36 | 1) < (int)uVar34) {
            local_3a8 = local_2b0.data;
            iVar32 = local_2e0->w;
            local_2f8 = local_2e0->data;
            sVar9 = local_2e0->elemsize;
            local_2e8 = local_2e0->cstep * sVar9;
            local_3a0 = (void *)((long)local_378 + local_300 * 4);
            uVar36 = uVar36 * iVar21 * 0x10;
            pvVar17 = (void *)(uVar29 & 0xffffffff);
            do {
              local_398 = pvVar17;
              local_380 = (ulong)uVar36;
              fVar37 = 0.0;
              fVar39 = 0.0;
              if (local_378 != (void *)0x0) {
                fVar39 = *(float *)((long)local_3a0 + (long)local_398 * 4);
                fVar37 = *(float *)((long)local_3a0 + (long)local_398 * 4 + 4);
              }
              if (0 < iVar21) {
                puVar24 = (undefined8 *)((long)local_2b0.data + (long)(int)uVar36 * 4);
                local_390 = (Mat *)((local_300 + (long)local_398) * local_2e8 + (long)local_2f8);
                uVar29 = 0;
                do {
                  iVar16 = iVar15 + (int)uVar29;
                  lVar31 = -0x20;
                  puVar25 = puVar24;
                  do {
                    uVar3 = *(ulong *)((long)puVar25 + (long)(iVar21 * 2) * 4);
                    auVar59._8_8_ = 0;
                    auVar59._0_8_ = uVar3;
                    uVar4 = *(ulong *)((long)puVar25 + (long)(iVar21 * 4) * 4);
                    auVar61._8_8_ = 0;
                    auVar61._0_8_ = uVar4;
                    auVar55._0_4_ = (float)uVar3 + (float)*puVar25 + (float)uVar4;
                    auVar55._4_4_ =
                         (float)(uVar3 >> 0x20) + (float)((ulong)*puVar25 >> 0x20) +
                         (float)(uVar4 >> 0x20);
                    auVar55._8_8_ = 0;
                    uVar5 = vmovlps_avx(auVar55);
                    *(undefined8 *)((long)&local_140 + lVar31) = uVar5;
                    auVar38 = vsubps_avx(auVar59,auVar61);
                    uVar5 = *(undefined8 *)((long)puVar25 + (long)(iVar21 * 6) * 4);
                    auVar56._0_4_ = auVar38._0_4_ + (float)uVar5;
                    auVar56._4_4_ = auVar38._4_4_ + (float)((ulong)uVar5 >> 0x20);
                    auVar56._8_4_ = auVar38._8_4_ + 0.0;
                    auVar56._12_4_ = auVar38._12_4_ + 0.0;
                    uVar5 = vmovlps_avx(auVar56);
                    *(undefined8 *)((long)local_120 + lVar31) = uVar5;
                    puVar25 = (undefined8 *)((long)puVar25 + (long)(iVar21 * 8) * 4);
                    lVar31 = lVar31 + 8;
                  } while (lVar31 != 0);
                  iVar11 = iVar16 % local_36c;
                  uVar12 = (iVar16 / local_36c) * 2;
                  pfVar26 = (float *)((long)&local_390->data +
                                     (long)(iVar11 * 2) * 4 +
                                     (long)(int)uVar12 * (long)iVar32 * sVar9);
                  pfVar30 = afStack_148 + 1;
                  lVar31 = 0;
                  do {
                    if ((int)(uVar12 | (uint)lVar31) < iVar35) {
                      fVar40 = pfVar30[-3];
                      fVar41 = pfVar30[-2];
                      fVar42 = pfVar30[-1];
                      fVar43 = pfVar30[-5];
                      fVar44 = *pfVar30;
                      fVar45 = pfVar30[-4];
                      fVar1 = pfVar30[-6];
                      *pfVar26 = fVar39 + fVar43 + pfVar30[-7] + fVar40;
                      pfVar26[(int)uVar33] = fVar37 + fVar45 + fVar1 + fVar41;
                      if (iVar11 * 2 + 1 < iVar20) {
                        pfVar26[1] = ((fVar39 + fVar43) - fVar40) + fVar42;
                        pfVar26[(long)(int)uVar33 + 1] = ((fVar37 + fVar45) - fVar41) + fVar44;
                      }
                      pfVar26 = pfVar26 + iVar20;
                    }
                    lVar31 = lVar31 + 1;
                    pfVar30 = pfVar30 + 8;
                  } while (lVar31 == 1);
                  uVar29 = uVar29 + 1;
                  puVar24 = puVar24 + 1;
                } while (uVar29 != (local_388 & 0xffffffff));
              }
              uVar36 = uVar36 + iVar21 * 0x20;
              pvVar17 = (void *)((long)local_398 + 2U);
            } while ((long)((long)local_398 + 3U) < local_200);
            uVar36 = (uint)(void *)((long)local_398 + 2U);
          }
          if ((int)uVar36 < (int)uVar34) {
            local_398 = local_2b0.data;
            local_3a0 = local_2e0->data;
            sVar9 = local_2e0->elemsize;
            sVar10 = local_2e0->cstep;
            local_390 = (Mat *)((long)local_2e0->w * sVar9);
            lVar31 = (long)(int)uVar36;
            local_3a8 = (void *)((long)local_378 + local_300 * 4);
            uVar33 = uVar36 * iVar21 * 0x10;
            do {
              local_380 = (ulong)uVar33;
              if (local_378 == (void *)0x0) {
                fVar37 = 0.0;
              }
              else {
                fVar37 = *(float *)((long)local_3a8 + lVar31 * 4);
              }
              if (0 < iVar21) {
                pfVar26 = (float *)((long)local_2b0.data + (long)(int)uVar33 * 4);
                uVar29 = 0;
                do {
                  iVar32 = iVar15 + (int)uVar29;
                  lVar18 = -0x10;
                  pfVar30 = pfVar26;
                  do {
                    fVar39 = pfVar30[iVar21];
                    fVar40 = pfVar30[iVar21 * 2];
                    *(float *)((long)&uStack_150 + lVar18) = fVar39 + *pfVar30 + fVar40;
                    *(float *)((long)&local_140 + lVar18) = (fVar39 - fVar40) + pfVar30[iVar21 * 3];
                    pfVar30 = pfVar30 + iVar21 * 4;
                    lVar18 = lVar18 + 4;
                  } while (lVar18 != 0);
                  iVar16 = iVar32 % local_36c;
                  uVar36 = (iVar32 / local_36c) * 2;
                  pfVar30 = (float *)((long)local_3a0 +
                                     (long)(iVar16 * 2) * 4 +
                                     (long)(int)uVar36 * (long)local_390 +
                                     (local_300 + lVar31) * sVar10 * sVar9);
                  pfVar27 = afStack_158 + 1;
                  lVar18 = 0;
                  do {
                    if ((int)(uVar36 | (uint)lVar18) < iVar35) {
                      fVar39 = pfVar27[-1];
                      fVar40 = pfVar27[-2];
                      fVar41 = *pfVar27;
                      *pfVar30 = fVar37 + fVar40 + pfVar27[-3] + fVar39;
                      if (iVar16 * 2 + 1 < iVar20) {
                        pfVar30[1] = ((fVar37 + fVar40) - fVar39) + fVar41;
                      }
                      pfVar30 = pfVar30 + iVar20;
                    }
                    lVar18 = lVar18 + 1;
                    pfVar27 = pfVar27 + 4;
                  } while (lVar18 == 1);
                  uVar29 = uVar29 + 1;
                  pfVar26 = pfVar26 + 1;
                } while (uVar29 != (local_388 & 0xffffffff));
              }
              lVar31 = lVar31 + 1;
              uVar33 = uVar33 + local_358;
            } while (lVar31 != local_200);
          }
          uVar29 = (ulong)(iVar15 + local_3ac);
        } while ((int)(iVar15 + local_3ac) < (int)local_2d0);
      }
      piVar13 = (int *)CONCAT44(local_2b0.refcount._4_4_,local_2b0.refcount._0_4_);
      if (piVar13 != (int *)0x0) {
        LOCK();
        *piVar13 = *piVar13 + -1;
        UNLOCK();
        if (*piVar13 == 0) {
          if (local_2b0.allocator == (Allocator *)0x0) {
            if (local_2b0.data != (void *)0x0) {
              free(local_2b0.data);
            }
          }
          else {
            (*(local_2b0.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      local_2b0.cstep = 0;
      local_2b0.data = (void *)0x0;
      local_2b0.refcount._0_4_ = 0;
      local_2b0.refcount._4_4_ = 0;
      local_2b0.elemsize = 0;
      local_2b0.elempack = 0;
      local_2b0.dims = 0;
      local_2b0.w = 0;
      local_2b0.h = 0;
      local_2b0.d = 0;
      local_2b0.c = 0;
      local_35c = local_35c + 1;
    } while (local_35c != local_2d4);
  }
  piVar13 = (int *)CONCAT44(local_350.refcount._4_4_,local_350.refcount._0_4_);
  if (piVar13 != (int *)0x0) {
    LOCK();
    *piVar13 = *piVar13 + -1;
    UNLOCK();
    if (*piVar13 == 0) {
      if (local_350.allocator == (Allocator *)0x0) {
        if (local_350.data != (void *)0x0) {
          free(local_350.data);
        }
      }
      else {
        (*(local_350.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  local_350.cstep = 0;
  local_350.data = (void *)0x0;
  local_350.refcount._0_4_ = 0;
  local_350.refcount._4_4_ = 0;
  local_350.elemsize = 0;
  local_350.elempack = 0;
  local_350.dims = 0;
  local_350.w = 0;
  local_350.h = 0;
  local_350.d = 0;
  local_350.c = 0;
  piVar13 = (int *)CONCAT44(local_260.refcount._4_4_,local_260.refcount._0_4_);
  if (piVar13 != (int *)0x0) {
    LOCK();
    *piVar13 = *piVar13 + -1;
    UNLOCK();
    if (*piVar13 == 0) {
      if (local_260.allocator == (Allocator *)0x0) {
        if (local_260.data != (void *)0x0) {
          free(local_260.data);
        }
      }
      else {
        (*(local_260.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return;
}

Assistant:

static void conv3x3s1_winograd23(const Mat& bottom_blob, Mat& top_blob, const Mat& AT, const Mat& bias, int nT, const Option& opt)
{
    int outw = top_blob.w;
    int outh = top_blob.h;

    // pad to 2n+2, winograd F(2,3)
    int w_tiles = (outw + 1) / 2;
    int h_tiles = (outh + 1) / 2;
    int tiles = w_tiles * h_tiles;

    const int M = top_blob.c * top_blob.elempack;
    const int N = tiles;
    const int K = bottom_blob.c * bottom_blob.elempack;
    const int B = 16;

    // NCNN_LOGE("conv3x3s1_winograd23 %d %d %d", M, N, K);

    int TILE_M, TILE_N, TILE_K;
    get_optimal_tile_mnk(M, N, K, TILE_M, TILE_N, TILE_K, nT);

    const int nn_M = (M + TILE_M - 1) / TILE_M;
    const int nn_N = (N + TILE_N - 1) / TILE_N;
    const int nn_K = (K + TILE_K - 1) / TILE_K;

    // NCNN_LOGE("TILE M/N/K = %d %d %d -> %d %d %d", M, N, K, TILE_M, TILE_N, TILE_K);

    Mat BT(TILE_K * TILE_N, B, (K + TILE_K - 1) / TILE_K, (N + TILE_N - 1) / TILE_N, 4u, opt.workspace_allocator);

    const int nn_NK = nn_N * nn_K;

    if (nT > 1 && nn_NK < nT)
    {
        Mat B_tile(TILE_N * B * TILE_K, 4u, opt.workspace_allocator);

        for (int ppjk = 0; ppjk < nn_NK; ppjk++)
        {
            const int ppj = ppjk / nn_K;
            const int ppk = ppjk % nn_K;

            const int j = ppj * TILE_N;
            const int k = ppk * TILE_K;

            const int max_jj = std::min((N - j), TILE_N);
            const int max_kk = std::min((K - k), TILE_K);

            // transform input
            conv3x3s1_winograd23_transform_input_tile(bottom_blob, B_tile, j, max_jj, k, max_kk, nT);

            Mat BT_tile = BT.channel(j / TILE_N).depth(k / TILE_K);

            transpose_pack_B_tile(B_tile, BT_tile, B, max_jj, max_kk, nT);
        }
    }
    else
    {
        Mat B_tileX(TILE_N * B * TILE_K, 1, nT, 4u, opt.workspace_allocator);

        #pragma omp parallel for num_threads(nT)
        for (int ppjk = 0; ppjk < nn_NK; ppjk++)
        {
            const int ppj = ppjk / nn_K;
            const int ppk = ppjk % nn_K;

            const int j = ppj * TILE_N;
            const int k = ppk * TILE_K;

            const int max_jj = std::min((N - j), TILE_N);
            const int max_kk = std::min((K - k), TILE_K);

            Mat B_tile = B_tileX.channel(get_omp_thread_num());

            // transform input
            conv3x3s1_winograd23_transform_input_tile(bottom_blob, B_tile, j, max_jj, k, max_kk, 1);

            Mat BT_tile = BT.channel(j / TILE_N).depth(k / TILE_K);

            transpose_pack_B_tile(B_tile, BT_tile, B, max_jj, max_kk, 1);
        }
    }

    Mat top_tileX(TILE_N * B * TILE_M, 1, nT, 4u, opt.workspace_allocator);

    #pragma omp parallel for num_threads(nT)
    for (int ppj = 0; ppj < nn_M; ppj++)
    {
        const int i = ppj * TILE_M;

        Mat top_tile = top_tileX.channel(get_omp_thread_num());

        const int max_ii = std::min((M - i), TILE_M);

        for (int j = 0; j < N; j += TILE_N)
        {
            const int max_jj = std::min((N - j), TILE_N);

            for (int k = 0; k < K; k += TILE_K)
            {
                const int max_kk = std::min((K - k), TILE_K);

                const Mat AT_tile = AT.channel(i / TILE_M).depth(k / TILE_K);

                const Mat BT_tile = BT.channel(j / TILE_N).depth(k / TILE_K);

                gemm_transB_packed_tile(AT_tile, BT_tile, top_tile, B, max_ii, max_jj, k, max_kk);
            }

            // transform output
            conv3x3s1_winograd23_transform_output_tile(top_tile, top_blob, bias, i, max_ii, j, max_jj);
        }
    }
}